

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O3

unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
__thiscall duckdb::WKBColumnWriter::InitializeWriteState(WKBColumnWriter *this,RowGroup *row_group)

{
  pointer pCVar1;
  pointer pCVar2;
  ParquetWriter *writer;
  tuple<duckdb::WKBColumnWriterState_*,_std::default_delete<duckdb::WKBColumnWriterState>_> this_00;
  pointer pWVar3;
  RowGroup *in_RDX;
  __uniq_ptr_impl<duckdb::WKBColumnWriterState,_std::default_delete<duckdb::WKBColumnWriterState>_>
  local_38;
  
  pCVar1 = (in_RDX->columns).
           super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
           super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pCVar2 = (in_RDX->columns).
           super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
           super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
           ._M_impl.super__Vector_impl_data._M_start;
  writer = (ParquetWriter *)
           (row_group->columns).
           super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
           super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00.
  super__Tuple_impl<0UL,_duckdb::WKBColumnWriterState_*,_std::default_delete<duckdb::WKBColumnWriterState>_>
  .super__Head_base<0UL,_duckdb::WKBColumnWriterState_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::WKBColumnWriterState_*,_std::default_delete<duckdb::WKBColumnWriterState>_>
        )operator_new(0x2a8);
  WKBColumnWriterState::WKBColumnWriterState
            ((WKBColumnWriterState *)
             this_00.
             super__Tuple_impl<0UL,_duckdb::WKBColumnWriterState_*,_std::default_delete<duckdb::WKBColumnWriterState>_>
             .super__Head_base<0UL,_duckdb::WKBColumnWriterState_*,_false>._M_head_impl,writer,
             in_RDX,((long)pCVar1 - (long)pCVar2 >> 7) * -0x3333333333333333);
  local_38._M_t.
  super__Tuple_impl<0UL,_duckdb::WKBColumnWriterState_*,_std::default_delete<duckdb::WKBColumnWriterState>_>
  .super__Head_base<0UL,_duckdb::WKBColumnWriterState_*,_false>._M_head_impl =
       (tuple<duckdb::WKBColumnWriterState_*,_std::default_delete<duckdb::WKBColumnWriterState>_>)
       (tuple<duckdb::WKBColumnWriterState_*,_std::default_delete<duckdb::WKBColumnWriterState>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::WKBColumnWriterState_*,_std::default_delete<duckdb::WKBColumnWriterState>_>
       .super__Head_base<0UL,_duckdb::WKBColumnWriterState_*,_false>._M_head_impl;
  pWVar3 = unique_ptr<duckdb::WKBColumnWriterState,_std::default_delete<duckdb::WKBColumnWriterState>,_true>
           ::operator->((unique_ptr<duckdb::WKBColumnWriterState,_std::default_delete<duckdb::WKBColumnWriterState>,_true>
                         *)&local_38);
  (pWVar3->
  super_StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetCastOperator>).
  encoding = RLE_DICTIONARY;
  PrimitiveColumnWriter::RegisterToRowGroup((PrimitiveColumnWriter *)row_group,in_RDX);
  (this->
  super_StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>).
  super_PrimitiveColumnWriter.super_ColumnWriter._vptr_ColumnWriter =
       (_func_int **)
       local_38._M_t.
       super__Tuple_impl<0UL,_duckdb::WKBColumnWriterState_*,_std::default_delete<duckdb::WKBColumnWriterState>_>
       .super__Head_base<0UL,_duckdb::WKBColumnWriterState_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>)
         (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>)
         this;
}

Assistant:

unique_ptr<ColumnWriterState> InitializeWriteState(duckdb_parquet::RowGroup &row_group) override {
		auto result = make_uniq<WKBColumnWriterState>(writer, row_group, row_group.columns.size());
		result->encoding = Encoding::RLE_DICTIONARY;
		RegisterToRowGroup(row_group);
		return std::move(result);
	}